

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O0

bool jsonip::parser::
     or_<jsonip::parser::char_<(char)45>,jsonip::parser::char_<(char)43>,jsonip::parser::identity<false>,jsonip::parser::identity<false>,jsonip::parser::identity<false>,jsonip::parser::identity<false>,jsonip::parser::identity<false>,jsonip::parser::identity<false>>
     ::match<jsonip::parser::ReaderState<jsonip::semantic_state,jsonip::parser::IStreamReader>>
               (ReaderState<jsonip::semantic_state,_jsonip::parser::IStreamReader> *state)

{
  bool bVar1;
  undefined1 local_12;
  bool var;
  ReaderState<jsonip::semantic_state,_jsonip::parser::IStreamReader> *state_local;
  
  ReaderState<jsonip::semantic_state,_jsonip::parser::IStreamReader>::push_state(state);
  bVar1 = char_<(char)45>::
          match<jsonip::parser::ReaderState<jsonip::semantic_state,jsonip::parser::IStreamReader>>
                    (state);
  local_12 = true;
  if (!bVar1) {
    bVar1 = char_<(char)43>::
            match<jsonip::parser::ReaderState<jsonip::semantic_state,jsonip::parser::IStreamReader>>
                      (state);
    local_12 = true;
    if (!bVar1) {
      bVar1 = identity<false>::
              match<jsonip::parser::ReaderState<jsonip::semantic_state,jsonip::parser::IStreamReader>>
                        (state);
      local_12 = true;
      if (!bVar1) {
        bVar1 = identity<false>::
                match<jsonip::parser::ReaderState<jsonip::semantic_state,jsonip::parser::IStreamReader>>
                          (state);
        local_12 = true;
        if (!bVar1) {
          bVar1 = identity<false>::
                  match<jsonip::parser::ReaderState<jsonip::semantic_state,jsonip::parser::IStreamReader>>
                            (state);
          local_12 = true;
          if (!bVar1) {
            bVar1 = identity<false>::
                    match<jsonip::parser::ReaderState<jsonip::semantic_state,jsonip::parser::IStreamReader>>
                              (state);
            local_12 = true;
            if (!bVar1) {
              bVar1 = identity<false>::
                      match<jsonip::parser::ReaderState<jsonip::semantic_state,jsonip::parser::IStreamReader>>
                                (state);
              local_12 = true;
              if (!bVar1) {
                local_12 = identity<false>::
                           match<jsonip::parser::ReaderState<jsonip::semantic_state,jsonip::parser::IStreamReader>>
                                     (state);
              }
            }
          }
        }
      }
    }
  }
  if (local_12 == false) {
    ReaderState<jsonip::semantic_state,_jsonip::parser::IStreamReader>::rollback(state);
  }
  else {
    ReaderState<jsonip::semantic_state,_jsonip::parser::IStreamReader>::commit(state);
  }
  return local_12;
}

Assistant:

static inline bool match(S& state)
        {
            state.push_state();

            bool var = C0::match(state) || C1::match(state) ||
                       C2::match(state) || C3::match(state) ||
                       C4::match(state) || C5::match(state) ||
                       C6::match(state) || C7::match(state);

            var ? state.commit() : state.rollback();

            return var;
        }